

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

void Vec_StrPutF_(Vec_Str_t *vOut,float Val)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar3;
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_003e5b75;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
      vOut->pArray = pcVar3;
    }
    vOut->nCap = (int)sVar4;
  }
LAB_003e5b75:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = SUB41(Val,0);
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_003e5beb;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
    }
    vOut->pArray = pcVar3;
    vOut->nCap = (int)sVar4;
  }
LAB_003e5beb:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = (char)((uint)Val >> 8);
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_003e5c61;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
    }
    vOut->pArray = pcVar3;
    vOut->nCap = (int)sVar4;
  }
LAB_003e5c61:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = (char)((uint)Val >> 0x10);
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_003e5ccc;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar4);
      }
    }
    vOut->pArray = pcVar3;
    vOut->nCap = (int)sVar4;
  }
LAB_003e5ccc:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = (char)((uint)Val >> 0x18);
  return;
}

Assistant:

static inline void Vec_StrPutF_( Vec_Str_t * vOut, float Val )   { Vec_StrPutF( vOut, Val );  }